

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>::dispose
          (ArrayBuilder<kj::MainBuilder::Impl::Arg> *this)

{
  Arg *pAVar1;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRVar2;
  Arg *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (Arg *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (Arg *)0x0;
    this->pos = (RemoveConst<kj::MainBuilder::Impl::Arg> *)0x0;
    this->endPtr = (Arg *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pAVar1,0x28,((long)pRVar2 - (long)pAVar1) / 0x28,
               ((long)pAVar3 - (long)pAVar1) / 0x28,
               ArrayDisposer::Dispose_<kj::MainBuilder::Impl::Arg,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }